

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INumberReader.cpp
# Opt level: O1

void __thiscall INumberReader::getWord(INumberReader *this,string *str)

{
  pointer pcVar1;
  char ch;
  bool bVar2;
  ulong uVar3;
  bool bVar4;
  INumberJudger iNumberJudger;
  string tempStr;
  INumberJudger local_91;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  while( true ) {
    ch = std::istream::get();
    if (ch == -1) break;
    bVar2 = IDictionary::isRealNumberContext(ch);
    if (!bVar2) break;
    std::__cxx11::string::push_back((char)&local_90);
  }
  if (0 < (int)(uint)local_88) {
    uVar3 = (ulong)((uint)local_88 & 0x7fffffff);
    do {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&local_90);
      std::__cxx11::string::operator=((string *)str,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      pcVar1 = (str->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + str->_M_string_length);
      bVar2 = INumberJudger::isNumber(&local_91,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      bVar4 = uVar3 != 1;
      uVar3 = uVar3 - 1;
    } while (!bVar2 && bVar4);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  return;
}

Assistant:

void INumberReader::getWord(std::string &str) {
    INumberJudger iNumberJudger;
    std::string tempStr;
    char tempChar;
    while((tempChar = this->m_ifs->get()) != EOF)
    {
        if(IDictionary::isRealNumberContext(tempChar))
        {
            tempStr+=tempChar;
        }
        else
        {
            break;
        }
    }
    int maxLen=tempStr.length();
    for(int i=0;i<maxLen;i++)
    {
        str=tempStr.substr(0,maxLen-i);
        if(iNumberJudger.isNumber(str))
        {
            break;
        }
    }
}